

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format_lite.h
# Opt level: O1

uint8_t * google::protobuf::internal::WireFormatLite::WriteInt32ToArrayWithField<1>
                    (EpsCopyOutputStream *stream,int32_t value,uint8_t *target)

{
  bool bVar1;
  byte *pbVar2;
  ulong uVar3;
  ulong uVar4;
  
  if (stream->end_ <= target) {
    target = io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
  }
  *target = '\b';
  pbVar2 = target + 1;
  uVar3 = (ulong)value;
  uVar4 = uVar3;
  if (0x7f < (uint)value) {
    do {
      *pbVar2 = (byte)uVar4 | 0x80;
      uVar3 = uVar4 >> 7;
      pbVar2 = pbVar2 + 1;
      bVar1 = 0x3fff < uVar4;
      uVar4 = uVar3;
    } while (bVar1);
  }
  *pbVar2 = (byte)uVar3;
  return pbVar2 + 1;
}

Assistant:

PROTOBUF_NOINLINE static uint8_t* WriteInt32ToArrayWithField(
      ::google::protobuf::io::EpsCopyOutputStream* stream, int32_t value,
      uint8_t* target) {
    target = stream->EnsureSpace(target);
    return WriteInt32ToArray(field_number, value, target);
  }